

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_wbl.c
# Opt level: O3

void beltWBLStepDOpt(void *buf,size_t count,void *state)

{
  long *plVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar3 = *buf;
  *(ulong *)((long)state + 0x30) = uVar3;
  uVar4 = *(ulong *)((long)buf + 8);
  *(ulong *)((long)state + 0x38) = uVar4;
  if (0x30 < count) {
    uVar6 = 0x30;
    do {
      uVar3 = uVar3 ^ *(ulong *)((long)buf + (uVar6 - 0x20));
      *(ulong *)((long)state + 0x30) = uVar3;
      uVar4 = uVar4 ^ *(ulong *)((long)buf + (uVar6 - 0x18));
      *(ulong *)((long)state + 0x38) = uVar4;
      uVar6 = uVar6 + 0x10;
    } while (uVar6 < count);
  }
  uVar3 = count + 0xf >> 3 & 0x1ffffffffffffffe;
  *(ulong *)((long)state + 0x40) = uVar3;
  if (uVar3 != 0) {
    uVar3 = count - 0x10;
    do {
      *(undefined8 *)((long)state + 0x20) = *(undefined8 *)((long)buf + uVar3);
      *(undefined8 *)((long)state + 0x28) = *(undefined8 *)((long)buf + uVar3 + 8);
      beltBlockEncr((octet *)((long)state + 0x20),(u32 *)state);
      memXor2((octet *)((long)state + 0x20),(void *)((long)state + 0x40),8);
      uVar6 = ((count + uVar3) - 0x10) % count;
      *(ulong *)((long)buf + uVar6) = *(ulong *)((long)buf + uVar6) ^ *(ulong *)((long)state + 0x20)
      ;
      puVar2 = (ulong *)((long)buf + uVar6 + 8);
      *puVar2 = *puVar2 ^ *(ulong *)((long)state + 0x28);
      *(ulong *)((long)buf + uVar3) = *(ulong *)((long)buf + uVar3) ^ *(ulong *)((long)state + 0x30)
      ;
      puVar2 = (ulong *)((long)buf + uVar3 + 8);
      *puVar2 = *puVar2 ^ *(ulong *)((long)state + 0x38);
      uVar5 = ((count + uVar3) - 0x20) % count;
      uVar4 = *(ulong *)((long)state + 0x30) ^ *(ulong *)((long)buf + uVar5);
      *(ulong *)((long)state + 0x30) = uVar4;
      uVar5 = *(ulong *)((long)state + 0x38) ^ *(ulong *)((long)buf + uVar5 + 8);
      *(ulong *)((long)state + 0x38) = uVar5;
      *(ulong *)((long)state + 0x30) = uVar4 ^ *(ulong *)((long)buf + uVar3);
      *(ulong *)((long)state + 0x38) = uVar5 ^ *(ulong *)((long)buf + uVar3 + 8);
      plVar1 = (long *)((long)state + 0x40);
      *plVar1 = *plVar1 + -1;
      uVar3 = uVar6;
    } while (*plVar1 != 0);
  }
  return;
}

Assistant:

void beltWBLStepDOpt(void* buf, size_t count, void* state)
{
	belt_wbl_st* st = (belt_wbl_st*)state;
	word n = ((word)count + 15) / 16;
	size_t i;
	ASSERT(count >= 32 && count % 16 == 0);
	ASSERT(memIsDisjoint2(buf, count, state, beltWBL_keep()));
	// sum <- r1 + ... + r_{n-2} (будущая сумма r2 + ... + r_{n-1})
	beltBlockCopy(st->sum, (octet*)buf);
	for (i = 16; i + 32 < count; i += 16)
		beltBlockXor2(st->sum, (octet*)buf + i);
	// 2 * n итераций (sum будет записываться по смещению i: 
	// это блок r* в начале такта и блок r1 в конце)
	for (st->round = 2 * n, i = count - 16; st->round; --st->round)
	{
		// block <- beltBlockEncr(r*) + <round>
		beltBlockCopy(st->block, (octet*)buf + i);
		beltBlockEncr(st->block, st->key);
#if (OCTET_ORDER == LITTLE_ENDIAN)
		memXor2(st->block, &st->round, O_PER_W);
#else // BIG_ENDIAN
		st->round = wordRev(st->round);
		memXor2(st->block, &st->round, O_PER_W);
		st->round = wordRev(st->round);
#endif // OCTET_ORDER
		// r* <- r* + block
		beltBlockXor2((octet*)buf + (i + count - 16) % count, st->block);
		// r1 <- pre r* + sum
		beltBlockXor2((octet*)buf + i, st->sum);
		// пересчитать sum: исключить старое слагаемое
		beltBlockXor2(st->sum, (octet*)buf + (i + count - 32) % count);
		// пересчитать sum: добавить новое слагаемое
		beltBlockXor2(st->sum, (octet*)buf + i);
		// назад
		i = (i + count - 16) % count;
	}
}